

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  bool bVar1;
  uint uVar2;
  TestCase *this_00;
  IStreamingReporter *pIVar3;
  pointer pUVar4;
  string *in_RDI;
  const_iterator itEnd;
  const_iterator it;
  TestFailureException *anon_var_0;
  ExpressionResultBuilder exResult;
  StreamRedirect cerrRedir;
  StreamRedirect coutRedir;
  AssertionInfo *in_stack_fffffffffffff898;
  pointer in_stack_fffffffffffff8a0;
  allocator *_capturedExpression;
  StreamRedirect *in_stack_fffffffffffff8d0;
  string *in_stack_fffffffffffff8d8;
  AssertionInfo *in_stack_fffffffffffff8e0;
  __normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
  local_718 [198];
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [55];
  allocator local_a9;
  string local_a8 [168];
  
  _capturedExpression = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"TEST_CASE",_capturedExpression);
  this_00 = RunningTest::getTestCase(*(RunningTest **)(in_RDI + 0x38));
  TestCase::getTestCaseInfo(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"",&local_e1);
  AssertionInfo::AssertionInfo
            (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
             (SourceLineInfo *)in_stack_fffffffffffff8d0,(string *)_capturedExpression,
             (Flags)((ulong)in_RDI >> 0x20));
  AssertionInfo::operator=((AssertionInfo *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  AssertionInfo::~AssertionInfo((AssertionInfo *)in_stack_fffffffffffff8a0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  RunningTest::reset(*(RunningTest **)(in_RDI + 0x38));
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->
                     ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 0x120));
  uVar2 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  local_e2 = (undefined1)uVar2;
  if ((uVar2 & 1) == 0) {
    RunningTest::getTestCase(*(RunningTest **)(in_RDI + 0x38));
    TestCase::invoke((TestCase *)0x1cfa81);
  }
  else {
    StreamRedirect::StreamRedirect(in_stack_fffffffffffff8d0,(ostream *)_capturedExpression,in_RDI);
    StreamRedirect::StreamRedirect(in_stack_fffffffffffff8d0,(ostream *)_capturedExpression,in_RDI);
    RunningTest::getTestCase(*(RunningTest **)(in_RDI + 0x38));
    TestCase::invoke((TestCase *)0x1cf7e8);
    StreamRedirect::~StreamRedirect(in_stack_fffffffffffff8d0);
    StreamRedirect::~StreamRedirect(in_stack_fffffffffffff8d0);
  }
  RunningTest::ranToCompletion((RunningTest *)in_stack_fffffffffffff8a0);
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::begin((vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
           *)in_stack_fffffffffffff898);
  __gnu_cxx::
  __normal_iterator<Catch::RunContext::UnfinishedSections_const*,std::vector<Catch::RunContext::UnfinishedSections,std::allocator<Catch::RunContext::UnfinishedSections>>>
  ::__normal_iterator<Catch::RunContext::UnfinishedSections*>
            ((__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
              *)in_stack_fffffffffffff8a0,
             (__normal_iterator<Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
              *)in_stack_fffffffffffff898);
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::end((vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
         *)in_stack_fffffffffffff898);
  __gnu_cxx::
  __normal_iterator<Catch::RunContext::UnfinishedSections_const*,std::vector<Catch::RunContext::UnfinishedSections,std::allocator<Catch::RunContext::UnfinishedSections>>>
  ::__normal_iterator<Catch::RunContext::UnfinishedSections*>
            ((__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
              *)in_stack_fffffffffffff8a0,
             (__normal_iterator<Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
              *)in_stack_fffffffffffff898);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
                        *)in_stack_fffffffffffff8a0,
                       (__normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
                        *)in_stack_fffffffffffff898);
    if (!bVar1) break;
    in_stack_fffffffffffff8a0 =
         __gnu_cxx::
         __normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
         ::operator->(local_718);
    pUVar4 = __gnu_cxx::
             __normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
             ::operator->(local_718);
    (**(code **)(*(long *)in_RDI + 0x20))(in_RDI,in_stack_fffffffffffff8a0,&pUVar4->prevAssertions);
    __gnu_cxx::
    __normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
    ::operator++(local_718);
  }
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::clear((vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
           *)0x1cfb2e);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)0x1cfb3f);
  return;
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", m_runningTest->getTestCase().getTestCaseInfo().lineInfo, "", ResultDisposition::Normal );
                m_runningTest->reset();

                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( std::cout, redirectedCout );
                    StreamRedirect cerrRedir( std::cerr, redirectedCerr );
                    m_runningTest->getTestCase().invoke();
                }
                else {
                    m_runningTest->getTestCase().invoke();
                }
                m_runningTest->ranToCompletion();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                ExpressionResultBuilder exResult( ResultWas::ThrewException );
                exResult << translateActiveException();
                actOnCurrentResult( exResult.buildResult( m_lastAssertionInfo )  );
            }
            for( std::vector<UnfinishedSections>::const_iterator it = m_unfinishedSections.begin(),
                        itEnd = m_unfinishedSections.end();
                    it != itEnd;
                    ++it )
                sectionEnded( it->info, it->prevAssertions );
            m_unfinishedSections.clear();
            m_messages.clear();
        }